

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void RemoveEmptyHistograms(VP8LHistogramSet *image_histo)

{
  int i;
  uint32_t size;
  VP8LHistogramSet *image_histo_local;
  
  size = 0;
  for (i = 0; i < image_histo->size; i = i + 1) {
    if (image_histo->histograms[i] != (VP8LHistogram *)0x0) {
      image_histo->histograms[size] = image_histo->histograms[i];
      size = size + 1;
    }
  }
  image_histo->size = size;
  return;
}

Assistant:

static void RemoveEmptyHistograms(VP8LHistogramSet* const image_histo) {
  uint32_t size;
  int i;
  for (i = 0, size = 0; i < image_histo->size; ++i) {
    if (image_histo->histograms[i] == NULL) continue;
    image_histo->histograms[size++] = image_histo->histograms[i];
  }
  image_histo->size = size;
}